

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O2

void __thiscall
cp::interpolation<double>::setInter5
          (interpolation<double> *this,double xb,double dxb,double ddxb,double xe,double dxe,
          double ddxe,double t)

{
  double dVar1;
  double dVar2;
  
  this->a[0] = xb;
  this->a[1] = dxb;
  this->a[2] = ddxb * 0.5;
  dVar2 = t * t;
  dVar1 = pow(t,3.0);
  this->a[3] = (((xe * 20.0 + xb * -20.0) - (dxe * 8.0 + dxb * 12.0) * t) -
               (ddxb * 3.0 - ddxe) * dVar2) / (dVar1 + dVar1);
  dVar1 = pow(t,4.0);
  this->a[4] = ((ddxb * 3.0 - (ddxe + ddxe)) * dVar2 +
               (dxe * 14.0 + dxb * 16.0) * t + xb * 30.0 + xe * -30.0) / (dVar1 + dVar1);
  dVar1 = pow(t,5.0);
  this->a[5] = (((xe * 12.0 + xb * -12.0) - (dxe * 6.0 + dxb * 6.0) * t) - (ddxb - ddxe) * dVar2) /
               (dVar1 + dVar1);
  return;
}

Assistant:

void interpolation<T>::setInter5(T xb, T dxb, T ddxb, T xe, T dxe, T ddxe, double t) {
    a[0] = xb;
    a[1] = dxb;
    a[2] = ddxb * 0.5;
    a[3] = (20.0*xe - 20.0*xb - ( 8.0*dxe + 12.0*dxb)*t - (3.0*ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 3));
    a[4] = (30.0*xb - 30.0*xe + (14.0*dxe + 16.0*dxb)*t + (3.0*ddxb - 2.0*ddxe)*pow(t, 2)) / (2.0*pow(t, 4));
    a[5] = (12.0*xe - 12.0*xb - ( 6.0*dxe +  6.0*dxb)*t - (    ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 5));
}